

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O3

string * draco::LowercaseMimeTypeExtension(string *__return_storage_ptr__,string *mime_type)

{
  long lVar1;
  string local_38;
  
  lVar1 = std::__cxx11::string::rfind((char)mime_type,0x2f);
  if ((lVar1 + 1U < 2) || (lVar1 == mime_type->_M_string_length - 1)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)mime_type);
    parser::ToLower(__return_storage_ptr__,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LowercaseMimeTypeExtension(const std::string &mime_type) {
  const size_t pos = mime_type.find_last_of('/');
  if (pos == 0 || pos == std::string::npos || pos == mime_type.length() - 1) {
    return "";
  }
  return parser::ToLower(mime_type.substr(pos + 1));
}